

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

void test_disjoint(void)

{
  uint64_t *puVar1;
  long lVar2;
  bool bVar3;
  _Bool _Var4;
  bitset_t *pbVar5;
  bitset_t *pbVar6;
  bitset_t *pbVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint64_t uVar11;
  int i;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong auStack_c8 [4];
  bitset_t *pbStack_a8;
  bitset_t *pbStack_a0;
  code *pcStack_98;
  bitset_t *pbStack_88;
  undefined8 uStack_80;
  bitset_t *pbStack_78;
  code *pcStack_70;
  bitset_t *pbStack_60;
  bitset_t *pbStack_58;
  bitset_t *pbStack_50;
  ulong uStack_48;
  ulong uStack_40;
  bitset_t *pbStack_38;
  code *pcStack_30;
  
  pcStack_30 = (code *)0x10212c;
  pbVar5 = bitset_create();
  uVar12 = 0;
  pcStack_30 = (code *)0x102137;
  pbVar6 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if ((uVar12 & 1) == 0) {
      uVar16 = 0x3e;
      pbVar7 = pbVar5;
      if (uVar13 < pbVar5->arraysize) goto LAB_0010218d;
      pcStack_30 = (code *)0x102175;
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
LAB_00102189:
      if (_Var4 != false) goto LAB_0010218d;
    }
    else {
      uVar16 = 0x3f;
      pbVar7 = pbVar6;
      if (pbVar6->arraysize <= uVar13) {
        pcStack_30 = (code *)0x102186;
        _Var4 = bitset_grow(pbVar6,uVar13 + 1);
        goto LAB_00102189;
      }
LAB_0010218d:
      uVar15 = (uint)uVar16 & (uint)uVar12;
      uVar16 = (ulong)uVar15;
      pbVar7->array[uVar13] = pbVar7->array[uVar13] | 1L << (sbyte)uVar15;
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_30 = (code *)0x1021b9;
  _Var4 = bitsets_disjoint(pbVar5,pbVar6);
  if (_Var4) {
    uVar16 = 0x20000000000000;
    if (pbVar5->arraysize < 8) {
      pcStack_30 = (code *)0x1021db;
      _Var4 = bitset_grow(pbVar5,8);
      if (_Var4) goto LAB_001021df;
    }
    else {
LAB_001021df:
      pbVar5->array[7] = pbVar5->array[7] | 0x20000000000000;
    }
    if (pbVar6->arraysize < 8) {
      pcStack_30 = (code *)0x1021fa;
      _Var4 = bitset_grow(pbVar6,8);
      if (_Var4) goto LAB_001021fe;
    }
    else {
LAB_001021fe:
      pbVar6->array[7] = pbVar6->array[7] | 0x20000000000000;
    }
    pcStack_30 = (code *)0x102210;
    _Var4 = bitsets_disjoint(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_30 = (code *)0x10221c;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_30 = (code *)0x102232;
    test_disjoint_cold_1();
  }
  pcStack_30 = test_intersects;
  test_disjoint_cold_2();
  pbStack_58 = (bitset_t *)0x102245;
  pbStack_50 = pbVar5;
  uStack_48 = uVar12;
  uStack_40 = uVar13;
  pbStack_38 = pbVar6;
  pcStack_30 = (code *)uVar16;
  pbVar5 = bitset_create();
  pbStack_58 = (bitset_t *)0x10224d;
  pbVar6 = bitset_create();
  pbStack_58 = (bitset_t *)0x102258;
  _Var4 = bitset_empty(pbVar5);
  if (_Var4) {
    uVar12 = 0;
    do {
      uVar13 = uVar12 >> 6;
      if ((uVar12 & 1) == 0) {
        uVar16 = 0x3e;
        pbVar7 = pbVar5;
        if (uVar13 < pbVar5->arraysize) goto LAB_001022b6;
        pbStack_58 = (bitset_t *)0x10229e;
        _Var4 = bitset_grow(pbVar5,uVar13 + 1);
LAB_001022b2:
        if (_Var4 != false) goto LAB_001022b6;
      }
      else {
        uVar16 = 0x3f;
        pbVar7 = pbVar6;
        if (pbVar6->arraysize <= uVar13) {
          pbStack_58 = (bitset_t *)0x1022af;
          _Var4 = bitset_grow(pbVar6,uVar13 + 1);
          goto LAB_001022b2;
        }
LAB_001022b6:
        uVar15 = (uint)uVar16 & (uint)uVar12;
        uVar16 = (ulong)uVar15;
        pbVar7->array[uVar13] = pbVar7->array[uVar13] | 1L << (sbyte)uVar15;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 1000);
    pbStack_58 = (bitset_t *)0x1022e2;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    if (_Var4) goto LAB_0010235b;
    uVar16 = 0x20000000000;
    if (pbVar5->arraysize < 0x10) {
      pbStack_58 = (bitset_t *)0x102304;
      _Var4 = bitset_grow(pbVar5,0x10);
      if (_Var4) goto LAB_00102308;
    }
    else {
LAB_00102308:
      pbVar5->array[0xf] = pbVar5->array[0xf] | 0x20000000000;
    }
    if (pbVar6->arraysize < 0x10) {
      pbStack_58 = (bitset_t *)0x102323;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_00102327;
    }
    else {
LAB_00102327:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pbStack_58 = (bitset_t *)0x102339;
    _Var4 = bitsets_intersect(pbVar5,pbVar6);
    if (_Var4) {
      pbStack_58 = (bitset_t *)0x102345;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pbStack_58 = (bitset_t *)0x10235b;
    test_intersects_cold_1();
LAB_0010235b:
    pbStack_58 = (bitset_t *)0x102360;
    test_intersects_cold_3();
  }
  pbStack_58 = (bitset_t *)test_contains_all_different_sizes;
  test_intersects_cold_2();
  pcStack_70 = (code *)0x102373;
  pbStack_60 = pbVar5;
  pbStack_58 = pbVar6;
  pbVar5 = bitset_create_with_capacity(10);
  pcStack_70 = (code *)0x102380;
  pbVar6 = bitset_create_with_capacity(5);
  if (pbVar5->arraysize == 0) {
    pcStack_70 = (code *)0x102397;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_0010239b;
  }
  else {
LAB_0010239b:
    *pbVar5->array = *pbVar5->array | 2;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_70 = (code *)0x1023b6;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023ba;
  }
  else {
LAB_001023ba:
    *pbVar5->array = *pbVar5->array | 0x10;
  }
  if (pbVar5->arraysize == 0) {
    pcStack_70 = (code *)0x1023d5;
    _Var4 = bitset_grow(pbVar5,1);
    if (_Var4) goto LAB_001023d9;
  }
  else {
LAB_001023d9:
    *pbVar5->array = *pbVar5->array | 0x40;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_70 = (code *)0x1023f4;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_001023f8;
  }
  else {
LAB_001023f8:
    *pbVar6->array = *pbVar6->array | 2;
  }
  if (pbVar6->arraysize == 0) {
    pcStack_70 = (code *)0x102413;
    _Var4 = bitset_grow(pbVar6,1);
    if (_Var4) goto LAB_00102417;
  }
  else {
LAB_00102417:
    *pbVar6->array = *pbVar6->array | 0x10;
  }
  pcStack_70 = (code *)0x102429;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_70 = (code *)0x102438;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (!_Var4) {
      pcStack_70 = (code *)0x102444;
      bitset_free(pbVar5);
      bitset_free(pbVar6);
      return;
    }
  }
  else {
    pcStack_70 = (code *)0x102458;
    test_contains_all_different_sizes_cold_1();
  }
  pcStack_70 = test_contains_all;
  test_contains_all_different_sizes_cold_2();
  pcStack_98 = (code *)0x10246a;
  pbStack_88 = pbVar5;
  uStack_80 = 1000;
  pbStack_78 = pbVar6;
  pcStack_70 = (code *)uVar16;
  pbVar5 = bitset_create();
  uVar12 = 0;
  pcStack_98 = (code *)0x102475;
  pbVar6 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_00102496:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    else {
      pcStack_98 = (code *)0x102492;
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_00102496;
    }
    if ((uVar12 & 1) == 0) {
      if (pbVar6->arraysize <= uVar13) {
        pcStack_98 = (code *)0x1024c1;
        _Var4 = bitset_grow(pbVar6,uVar13 + 1);
        if (!_Var4) goto LAB_001024da;
      }
      pbVar6->array[uVar13] = pbVar6->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
LAB_001024da:
    uVar12 = uVar12 + 1;
  } while (uVar12 != 1000);
  pcStack_98 = (code *)0x1024f1;
  _Var4 = bitset_contains_all(pbVar5,pbVar6);
  if (_Var4) {
    pcStack_98 = (code *)0x102500;
    _Var4 = bitset_contains_all(pbVar6,pbVar5);
    if (_Var4) goto LAB_0010256b;
    if (pbVar6->arraysize < 0x10) {
      pcStack_98 = (code *)0x102518;
      _Var4 = bitset_grow(pbVar6,0x10);
      if (_Var4) goto LAB_0010251c;
    }
    else {
LAB_0010251c:
      pbVar6->array[0xf] = pbVar6->array[0xf] | 0x20000000000;
    }
    pcStack_98 = (code *)0x102538;
    _Var4 = bitset_contains_all(pbVar5,pbVar6);
    if (!_Var4) {
      pcStack_98 = (code *)0x102547;
      _Var4 = bitset_contains_all(pbVar6,pbVar5);
      if (!_Var4) {
        pcStack_98 = (code *)0x102553;
        bitset_free(pbVar5);
        bitset_free(pbVar6);
        return;
      }
      goto LAB_00102575;
    }
  }
  else {
    pcStack_98 = (code *)0x10256b;
    test_contains_all_cold_1();
LAB_0010256b:
    pcStack_98 = (code *)0x102570;
    test_contains_all_cold_4();
  }
  pcStack_98 = (code *)0x102575;
  test_contains_all_cold_3();
LAB_00102575:
  pcStack_98 = test_next_bits_iterate;
  test_contains_all_cold_2();
  uVar13 = 0;
  pbStack_a8 = pbVar5;
  pbStack_a0 = pbVar6;
  pcStack_98 = (code *)uVar12;
  pbVar5 = bitset_create();
  do {
    uVar12 = uVar13 >> 6;
    if (uVar12 < pbVar5->arraysize) {
LAB_001025ab:
      pbVar5->array[uVar12] = pbVar5->array[uVar12] | 1L << ((byte)uVar13 & 0x3f);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar12 + 1);
      if (_Var4) goto LAB_001025ab;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if (uVar13 < pbVar5->arraysize) {
LAB_001025ed:
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
    else {
      _Var4 = bitset_grow(pbVar5,uVar13 + 1);
      if (_Var4) goto LAB_001025ed;
    }
  } while (uVar12 < 0x44a);
  uVar12 = pbVar5->arraysize;
  uVar13 = 0;
  lVar9 = 0;
LAB_0010261a:
  uVar16 = uVar13 >> 6;
  if (uVar16 < uVar12) {
    puVar1 = pbVar5->array;
    uVar11 = (puVar1[uVar16] >> ((byte)uVar13 & 0x3f)) << ((byte)uVar13 & 0x3f);
    uVar10 = uVar13 & 0xffffffffffffffc0;
    uVar8 = 0;
    do {
      while (uVar11 == 0) {
        uVar16 = uVar16 + 1;
        if (uVar16 == uVar12) goto LAB_0010268b;
        uVar10 = uVar10 + 0x40;
        uVar11 = puVar1[uVar16];
        if (2 < uVar8) goto LAB_0010268b;
      }
      uVar14 = 0;
      if (uVar11 != 0) {
        for (; (uVar11 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
        }
      }
      auStack_c8[uVar8] = uVar14 | uVar10;
      uVar14 = uVar11 - 1;
      if (uVar8 == 2) {
        uVar14 = 0xffffffffffffffff;
      }
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 & uVar14;
    } while (uVar8 != 3);
    uVar8 = 3;
LAB_0010268b:
    if (uVar8 != 0) {
      uVar13 = auStack_c8[uVar8 - 1];
    }
  }
  else {
    uVar8 = 0;
  }
  if (uVar8 != 0) {
    uVar16 = lVar9 * 2 + 800;
    uVar10 = 0;
    do {
      uVar14 = lVar9 + uVar10;
      if (99 < lVar9 + uVar10) {
        uVar14 = uVar16;
      }
      if (auStack_c8[uVar10] != uVar14) {
        test_next_bits_iterate_cold_1();
        goto LAB_001026f4;
      }
      uVar10 = uVar10 + 1;
      uVar16 = uVar16 + 2;
    } while (uVar8 != uVar10);
    uVar13 = uVar13 + 1;
    lVar9 = uVar8 + lVar9;
    goto LAB_0010261a;
  }
  if (lVar9 == 0x96) {
    bitset_free(pbVar5);
    return;
  }
LAB_001026f4:
  test_next_bits_iterate_cold_2();
  uVar12 = 0;
  pbVar5 = bitset_create();
  do {
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar13 + 1), _Var4)) {
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar12 & 0x3f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 100);
  uVar12 = 0x3e6;
  do {
    uVar12 = uVar12 + 2;
    uVar13 = uVar12 >> 6;
    if ((uVar13 < pbVar5->arraysize) || (_Var4 = bitset_grow(pbVar5,uVar13 + 1), _Var4)) {
      pbVar5->array[uVar13] = pbVar5->array[uVar13] | 1L << ((byte)uVar12 & 0x3e);
    }
  } while (uVar12 < 0x44a);
  uVar12 = 0;
  uVar13 = 0;
  do {
    uVar16 = uVar12 >> 6;
    if (uVar16 < pbVar5->arraysize) {
      uVar8 = pbVar5->array[uVar16] >> ((byte)uVar12 & 0x3f);
      if (uVar8 == 0) {
        lVar9 = uVar16 * -0x40;
        do {
          uVar16 = uVar16 + 1;
          if (pbVar5->arraysize == uVar16) goto LAB_001027e0;
          uVar8 = pbVar5->array[uVar16];
          lVar9 = lVar9 + -0x40;
        } while (uVar8 == 0);
        lVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        uVar12 = lVar2 - lVar9;
      }
      else {
        lVar9 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar12 = uVar12 + lVar9;
      }
      bVar3 = true;
    }
    else {
LAB_001027e0:
      bVar3 = false;
    }
    if (!bVar3) {
      if (uVar13 == 0x96) {
        bitset_free(pbVar5);
        return;
      }
      goto LAB_00102822;
    }
    uVar16 = uVar13 * 2 + 800;
    if (uVar13 < 100) {
      uVar16 = uVar13;
    }
    if (uVar12 != uVar16) {
      test_next_bit_iterate_cold_2();
LAB_00102822:
      test_next_bit_iterate_cold_1();
      test_next_bit_iterate();
      test_next_bits_iterate();
      test_set_to_val();
      test_construct();
      test_union_intersection();
      test_iterate();
      test_iterate2();
      test_max_min();
      test_counts();
      test_shift_right();
      test_shift_left();
      test_disjoint();
      test_intersects();
      test_contains_all();
      test_contains_all_different_sizes();
      puts("All TEST_ASSERTs passed. Code is probably ok.");
      return;
    }
    uVar13 = uVar13 + 1;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

void test_disjoint() {
  bitset_t *evens = bitset_create();
  bitset_t *odds = bitset_create();

  for (int i = 0; i < 1000; i++) {
    if (i % 2 == 0)
      bitset_set(evens, i);
    else
      bitset_set(odds, i);
  }

  TEST_ASSERT(bitsets_disjoint(evens, odds));

  bitset_set(evens, 501);
  bitset_set(odds, 501);

  TEST_ASSERT(!bitsets_disjoint(evens, odds));

  bitset_free(evens);
  bitset_free(odds);
}